

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::UpdateConversionPathTable(cmake *this)

{
  cmCacheManager *this_00;
  byte bVar1;
  char *pcVar2;
  undefined1 local_298 [8];
  string b;
  string a;
  ifstream table;
  allocator local_39;
  string local_38;
  char *local_18;
  char *tablepath;
  cmake *this_local;
  
  this_00 = this->CacheManager;
  tablepath = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_PATH_TRANSLATION_FILE",&local_39);
  pcVar2 = cmCacheManager::GetInitializedCacheValue(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (pcVar2 != (char *)0x0) {
    local_18 = pcVar2;
    std::ifstream::ifstream((void *)((long)&a.field_2 + 8),pcVar2,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&a.field_2 + *(long *)(a.field_2._8_8_ + -0x18) + 8));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)(b.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_298);
      while( true ) {
        bVar1 = std::ios::eof();
        if (((bVar1 ^ 0xff) & 1) == 0) break;
        std::operator>>((istream *)(a.field_2._M_local_buf + 8),
                        (string *)(b.field_2._M_local_buf + 8));
        std::operator>>((istream *)(a.field_2._M_local_buf + 8),(string *)local_298);
        cmsys::SystemTools::AddTranslationPath((string *)((long)&b.field_2 + 8),(string *)local_298)
        ;
      }
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::~string((string *)(b.field_2._M_local_buf + 8));
    }
    else {
      cmSystemTools::Error
                ("CMAKE_PATH_TRANSLATION_FILE set to ",local_18,". CMake can not open file.",
                 (char *)0x0);
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
    }
    std::ifstream::~ifstream((void *)((long)&a.field_2 + 8));
  }
  return;
}

Assistant:

void cmake::UpdateConversionPathTable()
{
  // Update the path conversion table with any specified file:
  const char* tablepath =
    this->CacheManager
        ->GetInitializedCacheValue("CMAKE_PATH_TRANSLATION_FILE");

  if(tablepath)
    {
    cmsys::ifstream table( tablepath );
    if(!table)
      {
      cmSystemTools::Error("CMAKE_PATH_TRANSLATION_FILE set to ", tablepath,
        ". CMake can not open file.");
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
      }
    else
      {
      std::string a, b;
      while(!table.eof())
        {
        // two entries per line
        table >> a; table >> b;
        cmSystemTools::AddTranslationPath( a, b);
        }
      }
    }
}